

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

ON_XMLVariant * __thiscall
ON_RenderContentPrivate::GetPropertyValue
          (ON_XMLVariant *__return_storage_ptr__,ON_RenderContentPrivate *this,wchar_t *name)

{
  int iVar1;
  ON_XMLProperty *pOVar2;
  undefined4 extraout_var;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar1 == 0) {
    ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
    pOVar2 = ON_XMLNode::GetNamedProperty(&this->m_node,name);
    if (pOVar2 != (ON_XMLProperty *)0x0) {
      iVar1 = (*pOVar2->_vptr_ON_XMLProperty[7])(pOVar2);
      ::ON_XMLVariant::operator=
                (__return_storage_ptr__,(ON_XMLVariant *)CONCAT44(extraout_var,iVar1));
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ON_XMLVariant ON_RenderContentPrivate::GetPropertyValue(const wchar_t* name) const
{
  // Gets a property from the content node. This is one of:
  //
  // - the material node <material... >
  // - the environment node <environment... >
  // - the texture node <texture... >

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  ON_XMLVariant v;

  const ON_XMLProperty* pProp = m_node.GetNamedProperty(name);
  if (nullptr != pProp)
  {
    v = pProp->GetValue();
  }

  return v;
}